

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O1

HighsInt Highs_getRanging(void *highs,double *col_cost_up_value,double *col_cost_up_objective,
                         HighsInt *col_cost_up_in_var,HighsInt *col_cost_up_ou_var,
                         double *col_cost_dn_value,double *col_cost_dn_objective,
                         HighsInt *col_cost_dn_in_var,HighsInt *col_cost_dn_ou_var,
                         double *col_bound_up_value,double *col_bound_up_objective,
                         HighsInt *col_bound_up_in_var,HighsInt *col_bound_up_ou_var,
                         double *col_bound_dn_value,double *col_bound_dn_objective,
                         HighsInt *col_bound_dn_in_var,HighsInt *col_bound_dn_ou_var,
                         double *row_bound_up_value,double *row_bound_up_objective,
                         HighsInt *row_bound_up_in_var,HighsInt *row_bound_up_ou_var,
                         double *row_bound_dn_value,double *row_bound_dn_objective,
                         HighsInt *row_bound_dn_in_var,HighsInt *row_bound_dn_ou_var)

{
  HighsStatus HVar1;
  long lVar2;
  long lVar3;
  HighsRanging local_278;
  
  local_278.valid = false;
  memset(&local_278.col_cost_up,0,0x240);
  HVar1 = Highs::getRanging((Highs *)highs,&local_278);
  if (HVar1 != kError) {
    lVar3 = (long)*(int *)((long)highs + 0x138);
    lVar2 = (long)*(int *)((long)highs + 0x13c);
    if (col_cost_up_value != (double *)0x0) {
      memcpy(col_cost_up_value,
             local_278.col_cost_up.value_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_cost_up_objective != (double *)0x0) {
      memcpy(col_cost_up_objective,
             local_278.col_cost_up.objective_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_cost_up_in_var != (HighsInt *)0x0) {
      memcpy(col_cost_up_in_var,
             local_278.col_cost_up.in_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 * 4);
    }
    if (col_cost_up_ou_var != (HighsInt *)0x0) {
      memcpy(col_cost_up_ou_var,
             local_278.col_cost_up.ou_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 * 4);
    }
    if (col_cost_dn_value != (double *)0x0) {
      memcpy(col_cost_dn_value,
             local_278.col_cost_dn.value_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_cost_dn_objective != (double *)0x0) {
      memcpy(col_cost_dn_objective,
             local_278.col_cost_dn.objective_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_cost_dn_in_var != (HighsInt *)0x0) {
      memcpy(col_cost_dn_in_var,
             local_278.col_cost_dn.in_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 * 4);
    }
    if (col_cost_dn_ou_var != (HighsInt *)0x0) {
      memcpy(col_cost_dn_ou_var,
             local_278.col_cost_dn.ou_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 * 4);
    }
    if (col_bound_up_value != (double *)0x0) {
      memcpy(col_bound_up_value,
             local_278.col_bound_up.value_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_bound_up_objective != (double *)0x0) {
      memcpy(col_bound_up_objective,
             local_278.col_bound_up.objective_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_bound_up_in_var != (HighsInt *)0x0) {
      memcpy(col_bound_up_in_var,
             local_278.col_bound_up.in_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 * 4);
    }
    if (col_bound_up_ou_var != (HighsInt *)0x0) {
      memcpy(col_bound_up_ou_var,
             local_278.col_bound_up.ou_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 * 4);
    }
    if (col_bound_dn_value != (double *)0x0) {
      memcpy(col_bound_dn_value,
             local_278.col_bound_dn.value_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_bound_dn_objective != (double *)0x0) {
      memcpy(col_bound_dn_objective,
             local_278.col_bound_dn.objective_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar3 * 8);
    }
    if (col_bound_dn_in_var != (HighsInt *)0x0) {
      memcpy(col_bound_dn_in_var,
             local_278.col_bound_dn.in_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 * 4);
    }
    if (col_bound_dn_ou_var != (HighsInt *)0x0) {
      memcpy(col_bound_dn_ou_var,
             local_278.col_bound_dn.ou_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar3 << 2);
    }
    if (row_bound_up_value != (double *)0x0) {
      memcpy(row_bound_up_value,
             local_278.row_bound_up.value_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar2 * 8);
    }
    if (row_bound_up_objective != (double *)0x0) {
      memcpy(row_bound_up_objective,
             local_278.row_bound_up.objective_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar2 * 8);
    }
    if (row_bound_up_in_var != (HighsInt *)0x0) {
      memcpy(row_bound_up_in_var,
             local_278.row_bound_up.in_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar2 * 4);
    }
    if (row_bound_up_ou_var != (HighsInt *)0x0) {
      memcpy(row_bound_up_ou_var,
             local_278.row_bound_up.ou_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar2 * 4);
    }
    if (row_bound_dn_value != (double *)0x0) {
      memcpy(row_bound_dn_value,
             local_278.row_bound_dn.value_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar2 * 8);
    }
    if (row_bound_dn_objective != (double *)0x0) {
      memcpy(row_bound_dn_objective,
             local_278.row_bound_dn.objective_.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start,lVar2 * 8);
    }
    if (row_bound_dn_in_var != (HighsInt *)0x0) {
      memcpy(row_bound_dn_in_var,
             local_278.row_bound_dn.in_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar2 * 4);
    }
    if (row_bound_dn_ou_var != (HighsInt *)0x0) {
      memcpy(row_bound_dn_ou_var,
             local_278.row_bound_dn.ou_var_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,lVar2 << 2);
    }
  }
  HighsRanging::~HighsRanging(&local_278);
  return HVar1;
}

Assistant:

HighsInt Highs_getRanging(
    void* highs,
    //
    double* col_cost_up_value, double* col_cost_up_objective,
    HighsInt* col_cost_up_in_var, HighsInt* col_cost_up_ou_var,
    double* col_cost_dn_value, double* col_cost_dn_objective,
    HighsInt* col_cost_dn_in_var, HighsInt* col_cost_dn_ou_var,
    double* col_bound_up_value, double* col_bound_up_objective,
    HighsInt* col_bound_up_in_var, HighsInt* col_bound_up_ou_var,
    double* col_bound_dn_value, double* col_bound_dn_objective,
    HighsInt* col_bound_dn_in_var, HighsInt* col_bound_dn_ou_var,
    double* row_bound_up_value, double* row_bound_up_objective,
    HighsInt* row_bound_up_in_var, HighsInt* row_bound_up_ou_var,
    double* row_bound_dn_value, double* row_bound_dn_objective,
    HighsInt* row_bound_dn_in_var, HighsInt* row_bound_dn_ou_var) {
  HighsRanging ranging;
  HighsInt status = (HighsInt)((Highs*)highs)->getRanging(ranging);
  if (status == (HighsInt)HighsStatus::kError) return status;
  HighsInt num_col = ((Highs*)highs)->getNumCol();
  HighsInt num_row = ((Highs*)highs)->getNumRow();
  if (col_cost_up_value)
    memcpy(col_cost_up_value, ranging.col_cost_up.value_.data(),
           num_col * sizeof(double));
  if (col_cost_up_objective)
    memcpy(col_cost_up_objective, ranging.col_cost_up.objective_.data(),
           num_col * sizeof(double));
  if (col_cost_up_in_var)
    memcpy(col_cost_up_in_var, ranging.col_cost_up.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_cost_up_ou_var)
    memcpy(col_cost_up_ou_var, ranging.col_cost_up.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (col_cost_dn_value)
    memcpy(col_cost_dn_value, ranging.col_cost_dn.value_.data(),
           num_col * sizeof(double));
  if (col_cost_dn_objective)
    memcpy(col_cost_dn_objective, ranging.col_cost_dn.objective_.data(),
           num_col * sizeof(double));
  if (col_cost_dn_in_var)
    memcpy(col_cost_dn_in_var, ranging.col_cost_dn.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_cost_dn_ou_var)
    memcpy(col_cost_dn_ou_var, ranging.col_cost_dn.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (col_bound_up_value)
    memcpy(col_bound_up_value, ranging.col_bound_up.value_.data(),
           num_col * sizeof(double));
  if (col_bound_up_objective)
    memcpy(col_bound_up_objective, ranging.col_bound_up.objective_.data(),
           num_col * sizeof(double));
  if (col_bound_up_in_var)
    memcpy(col_bound_up_in_var, ranging.col_bound_up.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_bound_up_ou_var)
    memcpy(col_bound_up_ou_var, ranging.col_bound_up.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (col_bound_dn_value)
    memcpy(col_bound_dn_value, ranging.col_bound_dn.value_.data(),
           num_col * sizeof(double));
  if (col_bound_dn_objective)
    memcpy(col_bound_dn_objective, ranging.col_bound_dn.objective_.data(),
           num_col * sizeof(double));
  if (col_bound_dn_in_var)
    memcpy(col_bound_dn_in_var, ranging.col_bound_dn.in_var_.data(),
           num_col * sizeof(HighsInt));
  if (col_bound_dn_ou_var)
    memcpy(col_bound_dn_ou_var, ranging.col_bound_dn.ou_var_.data(),
           num_col * sizeof(HighsInt));

  if (row_bound_up_value)
    memcpy(row_bound_up_value, ranging.row_bound_up.value_.data(),
           num_row * sizeof(double));
  if (row_bound_up_objective)
    memcpy(row_bound_up_objective, ranging.row_bound_up.objective_.data(),
           num_row * sizeof(double));
  if (row_bound_up_in_var)
    memcpy(row_bound_up_in_var, ranging.row_bound_up.in_var_.data(),
           num_row * sizeof(HighsInt));
  if (row_bound_up_ou_var)
    memcpy(row_bound_up_ou_var, ranging.row_bound_up.ou_var_.data(),
           num_row * sizeof(HighsInt));

  if (row_bound_dn_value)
    memcpy(row_bound_dn_value, ranging.row_bound_dn.value_.data(),
           num_row * sizeof(double));
  if (row_bound_dn_objective)
    memcpy(row_bound_dn_objective, ranging.row_bound_dn.objective_.data(),
           num_row * sizeof(double));
  if (row_bound_dn_in_var)
    memcpy(row_bound_dn_in_var, ranging.row_bound_dn.in_var_.data(),
           num_row * sizeof(HighsInt));
  if (row_bound_dn_ou_var)
    memcpy(row_bound_dn_ou_var, ranging.row_bound_dn.ou_var_.data(),
           num_row * sizeof(HighsInt));

  return status;
}